

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O1

bool __thiscall USDFParser::ParseChoice(USDFParser *this,FStrifeDialogueReply ***replyptr)

{
  FStrifeDialogueReply **ppFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FStrifeDialogueReply *__s;
  long lVar6;
  size_t sVar7;
  PClassActor *pPVar8;
  char *pcVar9;
  FString *this_00;
  bool block;
  FName key;
  FString LogString;
  FString QuickNo;
  FString QuickYes;
  FString ReplyString;
  undefined1 local_5c [12];
  FString local_50;
  FString local_48;
  FString local_40 [2];
  
  __s = (FStrifeDialogueReply *)operator_new(0x88);
  memset(__s,0,0x88);
  ppFVar1 = *replyptr;
  __s->Next = *ppFVar1;
  *ppFVar1 = __s;
  *replyptr = (FStrifeDialogueReply **)__s;
  local_40[0].Chars = FString::NullString.Nothing;
  local_48.Chars = FString::NullString.Nothing;
  local_50.Chars = FString::NullString.Nothing;
  local_5c._4_8_ = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 4;
  __s->NeedsGold = false;
  bVar3 = false;
LAB_004664d1:
  bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar2) {
    if (((__s->ItemCheck).Count != 0) && (((__s->ItemCheck).Array)->Amount < 1)) {
      __s->NeedsGold = false;
    }
    pcVar9 = ncopystring(local_40[0].Chars);
    __s->Reply = pcVar9;
    pcVar9 = ncopystring(local_48.Chars);
    __s->QuickYes = pcVar9;
    if (((__s->ItemCheck).Count == 0) || (((__s->ItemCheck).Array)->Item == (PClassInventory *)0x0))
    {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = ncopystring(local_50.Chars);
    }
    __s->QuickNo = pcVar9;
    pcVar9 = ncopystring((char *)local_5c._4_8_);
    __s->LogString = pcVar9;
    if (bVar3 == false) {
      __s->NextNode = -__s->NextNode;
    }
    FString::~FString((FString *)(local_5c + 4));
    FString::~FString(&local_50);
    FString::~FString(&local_48);
    FString::~FString(local_40);
    return true;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)local_5c,SUB81(this,0),(bool *)0x1);
  lVar6 = (long)(int)local_5c._0_4_;
  switch(local_5c._0_4_) {
  case 0x1df:
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    this_00 = local_40;
    break;
  case 0x1e0:
    bVar2 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    __s->NeedsGold = bVar2;
    goto LAB_004664d1;
  case 0x1e1:
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    this_00 = &local_48;
    break;
  case 0x1e2:
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    this_00 = &local_50;
    break;
  case 0x1e3:
    if ((this->super_UDMFParserBase).namespace_bits == 2) {
      pcVar9 = UDMFParserBase::CheckString
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
      sVar7 = strlen(pcVar9);
      if ((sVar7 < 4) || (iVar4 = strncasecmp(pcVar9,"LOG",3), iVar4 != 0)) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Log must be in the format of LOG# to compile, ignoring.");
      }
      else {
        iVar4 = atoi(pcVar9 + 3);
        __s->LogNumber = iVar4;
      }
      goto LAB_004664d1;
    }
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    this_00 = (FString *)(local_5c + 4);
    break;
  case 0x1e4:
    pPVar8 = CheckActorType(this,FName::NameData.NameArray[lVar6].Text);
    __s->GiveType = pPVar8;
    goto LAB_004664d1;
  case 0x1e5:
    iVar4 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    __s->NextNode = iVar4;
    goto LAB_004664d1;
  case 0x1e6:
    bVar3 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    goto LAB_004664d1;
  default:
    goto switchD_00466560_default;
  }
  FString::operator=(this_00,pcVar9);
  goto LAB_004664d1;
switchD_00466560_default:
  if (local_5c._0_4_ - 0x118 < 5) {
    iVar4 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    *(int *)((long)__s + (long)(int)local_5c._0_4_ * 4 + -0x44c) = iVar4;
  }
  else if (local_5c._0_4_ == 0xed) {
    uVar5 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[lVar6].Text);
    if (0xff < uVar5) {
      uVar5 = 0;
    }
    __s->ActionSpecial = uVar5;
  }
  goto LAB_004664d1;
}

Assistant:

bool ParseChoice(FStrifeDialogueReply **&replyptr)
	{
		FStrifeDialogueReply *reply = new FStrifeDialogueReply;
		memset(reply, 0, sizeof(*reply));

		reply->Next = *replyptr;
		*replyptr = reply;
		replyptr = &reply->Next;

		FString ReplyString;
		FString QuickYes;
		FString QuickNo;
		FString LogString;
		bool closeDialog = false;


		reply->NeedsGold = false;
		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Text:
					ReplyString = CheckString(key);
					break;

				case NAME_Displaycost:
					reply->NeedsGold = CheckBool(key);
					break;

				case NAME_Yesmessage:
					QuickYes = CheckString(key);
					//if (!QuickYes.Compare("_")) QuickYes = "";
					break;

				case NAME_Nomessage:
					QuickNo = CheckString(key);
					break;

				case NAME_Log:
					if (namespace_bits == St)
					{
						const char *s = CheckString(key);
						if(strlen(s) < 4 || strnicmp(s, "LOG", 3) != 0)
						{
							sc.ScriptMessage("Log must be in the format of LOG# to compile, ignoring.");
						}
						else
						{
							reply->LogNumber = atoi(s + 3);
						}
					}
					else
					{
						LogString = CheckString(key);
					}
					break;

				case NAME_Giveitem:
					reply->GiveType = CheckActorType(key);
					break;

				case NAME_Nextpage:
					reply->NextNode = CheckInt(key);
					break;

				case NAME_Closedialog:
					closeDialog = CheckBool(key);
					break;

				case NAME_Special:
					reply->ActionSpecial = CheckInt(key);
					if (reply->ActionSpecial < 0 || reply->ActionSpecial > 255)
						reply->ActionSpecial = 0;
					break;

				case NAME_Arg0:
				case NAME_Arg1:
				case NAME_Arg2:
				case NAME_Arg3:
				case NAME_Arg4:
					reply->Args[int(key)-int(NAME_Arg0)] = CheckInt(key);
					break;


				}
			}
			else
			{
				switch(key)
				{
				case NAME_Cost:
				case NAME_Require:
				case NAME_Exclude:
					// Require and Exclude are exclusive to namespace ZDoom. [FishyClockwork]
					if (key == NAME_Cost || namespace_bits == Zd)
					{
						ParseCostRequireExclude(reply, key);
						break;
					}
					// Intentional fall-through

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		// Todo: Finalize
		if (reply->ItemCheck.Size() > 0)
		{
			if (reply->ItemCheck[0].Amount <= 0) reply->NeedsGold = false;
		}

		reply->Reply = ncopystring(ReplyString);
		reply->QuickYes = ncopystring(QuickYes);
		if (reply->ItemCheck.Size() > 0 && reply->ItemCheck[0].Item != NULL)
		{
			reply->QuickNo = ncopystring(QuickNo);
		}
		else
		{
			reply->QuickNo = NULL;
		}
		reply->LogString = ncopystring(LogString);
		if(!closeDialog) reply->NextNode *= -1;
		return true;
	}